

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall
AsyncRgbLedAnalyzerSettings::SetSettingsFromInterfaces(AsyncRgbLedAnalyzerSettings *this)

{
  double dVar1;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  dVar1 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mLEDController = (int)dVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  return true;
}

Assistant:

bool AsyncRgbLedAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    // explicit cast to keep MSVC happy
    const int index = static_cast<int>( mControllerInterface->GetNumber() );
    mLEDController = static_cast<Controller>( index );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, true );

    return true;
}